

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_define_foreign_aux
               (sexp ctx,sexp env,char *name,int num_args,int flags,char *fname,sexp_proc1 f,
               sexp data)

{
  sexp local_50;
  sexp local_48;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_40.var = &local_48;
  local_48 = (sexp)0x43e;
  local_30.var = &local_50;
  local_50 = (sexp)0x43e;
  local_30.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_50 = sexp_make_foreign(ctx,name,num_args,flags,fname,f,data);
  if ((((ulong)local_50 & 3) != 0) || (local_50->tag != 0x13)) {
    local_48 = sexp_intern(ctx,name,-1);
    sexp_env_define(ctx,env,local_48,local_50);
  }
  (ctx->value).context.saves = local_40.next;
  return local_50;
}

Assistant:

sexp sexp_define_foreign_aux (sexp ctx, sexp env, const char *name, int num_args,
                              int flags, const char *fname, sexp_proc1 f, sexp data) {
  sexp_gc_var2(sym, res);
  sexp_gc_preserve2(ctx, sym, res);
  res = sexp_make_foreign(ctx, name, num_args, flags, fname, f, data);
  if (!sexp_exceptionp(res))
    sexp_env_define(ctx, env, sym = sexp_intern(ctx, name, -1), res);
  sexp_gc_release2(ctx);
  return res;
}